

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

void board_moveLinkMake(Board *board,MoveLink *lastLink)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Move *moveLinks [2048];
  undefined8 auStack_4028 [2051];
  
  if (lastLink != (MoveLink *)0x0) {
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (SCARRY8(lVar3,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      auStack_4028[lVar3 + 2] = lastLink->move;
      lastLink = lastLink->prev;
      lVar2 = lVar3 + 1;
    } while (lastLink != (MoveLink *)0x0);
    if (0 < lVar3 + 1) {
      uVar4 = lVar3 + 2;
      do {
        auStack_4028[1] = 0x106407;
        board_moveMake(board,(Move *)auStack_4028[uVar4]);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  return;
}

Assistant:

void board_moveLinkMake(Board * board, MoveLink * lastLink)
{
	Move * moveLinks[2048];
	long i=0;

	while(lastLink)
	{
		moveLinks[i++] = lastLink->move;
		lastLink = lastLink->prev;
	}

	for(--i;i>=0;i--)
	{
		board_moveMake(board, moveLinks[i]);
	}
}